

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::
SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
::emplaceRealloc<>(SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *this,pointer pos)

{
  EVP_PKEY_CTX *pEVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer puVar8;
  pointer puVar9;
  long lVar10;
  size_type sVar11;
  long lVar12;
  EVP_PKEY_CTX *ctx;
  ulong uVar13;
  
  if (this->len == 0x2aaaaaaaaaaaaaa) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar4 = this->cap;
  if (uVar13 < uVar4 * 2) {
    uVar13 = uVar4 * 2;
  }
  if (0x2aaaaaaaaaaaaaa - uVar4 < uVar4) {
    uVar13 = 0x2aaaaaaaaaaaaaa;
  }
  lVar12 = (long)pos - (long)this->data_;
  puVar8 = (pointer)operator_new(uVar13 * 0x30);
  *(undefined8 *)((long)puVar8 + lVar12) = 0x3f;
  *(undefined8 *)((long)puVar8 + lVar12 + 8) = 1;
  *(undefined8 *)((long)puVar8 + lVar12 + 0x18) = 0;
  *(undefined1 **)((long)puVar8 + lVar12 + 0x10) =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  puVar2 = (undefined8 *)((long)puVar8 + lVar12 + 0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar9 = this->data_;
  sVar11 = this->len;
  ctx = (EVP_PKEY_CTX *)(puVar9 + sVar11);
  if (ctx == (EVP_PKEY_CTX *)pos) {
    if (sVar11 != 0) {
      lVar10 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar10);
        ctx = (EVP_PKEY_CTX *)(puVar2 + 6);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        uVar7 = puVar2[3];
        puVar3 = (undefined8 *)
                 ((long)&(puVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_ + lVar10);
        *puVar3 = puVar2[2];
        puVar3[1] = uVar7;
        puVar3 = (undefined8 *)
                 ((long)&(puVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar10);
        *puVar3 = uVar5;
        puVar3[1] = uVar6;
        uVar5 = puVar2[5];
        puVar3 = (undefined8 *)
                 ((long)&(puVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .size_ctrl.ml + lVar10);
        *puVar3 = puVar2[4];
        puVar3[1] = uVar5;
        *puVar2 = 0x3f;
        puVar2[1] = 1;
        puVar2[2] = &boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage;
        puVar2[3] = 0;
        puVar2[4] = 0;
        puVar2[5] = 0;
        lVar10 = lVar10 + 0x30;
      } while (ctx != (EVP_PKEY_CTX *)pos);
    }
  }
  else {
    if (puVar9 != pos) {
      lVar10 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar10);
        ctx = (EVP_PKEY_CTX *)(puVar2 + 6);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        uVar7 = puVar2[3];
        puVar3 = (undefined8 *)
                 ((long)&(puVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_ + lVar10);
        *puVar3 = puVar2[2];
        puVar3[1] = uVar7;
        puVar3 = (undefined8 *)
                 ((long)&(puVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar10);
        *puVar3 = uVar5;
        puVar3[1] = uVar6;
        uVar5 = puVar2[5];
        puVar3 = (undefined8 *)
                 ((long)&(puVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .size_ctrl.ml + lVar10);
        *puVar3 = puVar2[4];
        puVar3[1] = uVar5;
        *puVar2 = 0x3f;
        puVar2[1] = 1;
        puVar2[2] = &boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage;
        puVar2[3] = 0;
        puVar2[4] = 0;
        puVar2[5] = 0;
        lVar10 = lVar10 + 0x30;
      } while (ctx != (EVP_PKEY_CTX *)pos);
      puVar9 = this->data_;
      sVar11 = this->len;
    }
    if ((EVP_PKEY_CTX *)(puVar9 + sVar11) != (EVP_PKEY_CTX *)pos) {
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        pEVar1 = ctx + (long)&pos->table_;
        uVar5 = *(undefined8 *)pEVar1;
        uVar6 = *(undefined8 *)(pEVar1 + 8);
        uVar7 = *(undefined8 *)(pEVar1 + 0x18);
        *(undefined8 *)(ctx + (long)puVar8 + lVar12 + 0x40) = *(undefined8 *)(pEVar1 + 0x10);
        *(undefined8 *)(ctx + (long)puVar8 + lVar12 + 0x40 + 8) = uVar7;
        *(undefined8 *)(ctx + (long)puVar8 + lVar12 + 0x30) = uVar5;
        *(undefined8 *)(ctx + (long)puVar8 + lVar12 + 0x30 + 8) = uVar6;
        uVar5 = *(undefined8 *)(pEVar1 + 0x28);
        *(undefined8 *)(ctx + (long)puVar8 + lVar12 + 0x50) = *(undefined8 *)(pEVar1 + 0x20);
        *(undefined8 *)(ctx + (long)puVar8 + lVar12 + 0x50 + 8) = uVar5;
        *(undefined8 *)pEVar1 = 0x3f;
        *(undefined8 *)(pEVar1 + 8) = 1;
        *(undefined1 **)(pEVar1 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar1 + 0x18) = 0;
        *(undefined8 *)(pEVar1 + 0x20) = 0;
        *(undefined8 *)(pEVar1 + 0x28) = 0;
        ctx = ctx + 0x30;
      } while (pEVar1 + 0x30 != (EVP_PKEY_CTX *)(puVar9 + sVar11));
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar13;
  this->data_ = puVar8;
  return (pointer)((long)puVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}